

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

void __thiscall nonius::standard_reporter::~standard_reporter(standard_reporter *this)

{
  standard_reporter *in_RDI;
  
  ~standard_reporter(in_RDI);
  operator_delete(in_RDI,0x58);
  return;
}

Assistant:

std::string description() override {
            return "the standard reporter";
        }